

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void av1_fwd_txfm2d_8x16_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int iVar1;
  int iVar2;
  byte in_CL;
  int lr_flip;
  int ud_flip;
  int8_t bit;
  transform_1d_avx2_conflict2 row_txfm;
  transform_1d_avx2_conflict2 col_txfm;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m256i out [16];
  __m256i in [16];
  int in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  int32_t *in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  int in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  char cVar3;
  __m256i *out_00;
  __m256i *in_00;
  undefined1 local_460 [212];
  int in_stack_fffffffffffffc74;
  int in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  __m256i *in_stack_fffffffffffffc80;
  __m256i *in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  __m256i *in_stack_fffffffffffffca8;
  __m256i *in_stack_fffffffffffffcb0;
  undefined1 local_260 [539];
  byte local_45;
  
  local_45 = in_CL;
  iVar1 = get_txw_idx('\a');
  iVar2 = get_txh_idx('\a');
  in_00 = (__m256i *)col_highbd_txfm8x16_arr[local_45];
  out_00 = (__m256i *)row_highbd_txfm8x8_arr[local_45];
  iVar1 = CONCAT13(av1_fwd_cos_bit_col[iVar1][iVar2],(int3)in_stack_fffffffffffffb7c);
  get_flip_cfg(local_45,(int *)&stack0xfffffffffffffb78,(int *)&stack0xfffffffffffffb74);
  load_buffer_8x16_avx2
            ((int16_t *)in_00,out_00,iVar1,in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
             in_stack_fffffffffffffb70);
  cVar3 = (char)((uint)iVar1 >> 0x18);
  (*(code *)in_00)(local_260,local_460,(int)cVar3,1);
  col_txfm_8x8_rounding(in_00,(int)((ulong)out_00 >> 0x20));
  col_txfm_8x8_rounding(in_00,(int)((ulong)out_00 >> 0x20));
  fwd_txfm_transpose_8x8_avx2
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
             in_stack_fffffffffffffca0);
  fwd_txfm_transpose_8x8_avx2
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
             in_stack_fffffffffffffca0);
  (*(code *)out_00)(local_260,local_460,(int)cVar3,2);
  round_shift_rect_array_32_avx2
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
             in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
  store_buffer_avx2((__m256i *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    in_stack_fffffffffffffb68,in_stack_fffffffffffffb64,in_stack_fffffffffffffb60);
  return;
}

Assistant:

void av1_fwd_txfm2d_8x16_avx2(const int16_t *input, int32_t *coeff, int stride,
                              TX_TYPE tx_type, int bd) {
  __m256i in[16], out[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const transform_1d_avx2 col_txfm = col_highbd_txfm8x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_highbd_txfm8x8_arr[tx_type];
  const int8_t bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_8x16_avx2(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, out, bit, 1, 1);
  col_txfm_8x8_rounding(out, -shift[1]);
  col_txfm_8x8_rounding(&out[8], -shift[1]);
  fwd_txfm_transpose_8x8_avx2(out, in, 1, 2);
  fwd_txfm_transpose_8x8_avx2(&out[8], &in[1], 1, 2);
  row_txfm(in, out, bit, 2, 2);
  round_shift_rect_array_32_avx2(out, in, 16, -shift[2], NewSqrt2);
  store_buffer_avx2(in, coeff, 8, 16);
  (void)bd;
}